

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_16777232,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_true>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  size_t sVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  AABBNodeMB4D *node1;
  ulong uVar9;
  RTCIntersectFunctionN p_Var10;
  long lVar11;
  ulong uVar12;
  NodeRef *pNVar13;
  size_t sVar14;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar15;
  uint uVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar22;
  undefined1 auVar23 [16];
  float fVar24;
  undefined1 auVar25 [16];
  float fVar31;
  undefined1 auVar26 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar27;
  float fVar29;
  float fVar30;
  undefined1 in_ZMM2 [64];
  undefined1 auVar28 [64];
  vint4 ai_2;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 ai_1;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_3;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  vint4 bi;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi_1;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  vint4 bi_3;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai;
  undefined1 auVar51 [16];
  vint4 bi_2;
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 local_1808 [16];
  RTCIntersectFunctionNArguments local_17c0;
  Geometry *local_1790;
  undefined8 local_1788;
  RTCIntersectArguments *local_1780;
  undefined1 local_1778 [16];
  undefined1 local_1768 [16];
  undefined1 local_1758 [16];
  undefined8 local_1748;
  undefined8 uStack_1740;
  undefined1 local_1738 [16];
  float local_1728;
  float fStack_1724;
  float fStack_1720;
  float fStack_171c;
  undefined1 local_1718 [16];
  undefined1 local_1708 [8];
  float fStack_1700;
  float fStack_16fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_16f8;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar14 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar14 != 8) {
    auVar20 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar26 = vpcmpeqd_avx(auVar20,(undefined1  [16])valid_i->field_0);
    auVar3 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    auVar33 = auVar26 & auVar3;
    if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar33[0xf] < '\0')
    {
      auVar3 = vandps_avx(auVar3,auVar26);
      local_1758 = *(undefined1 (*) [16])ray;
      auVar52 = ZEXT1664(local_1758);
      local_1768 = *(undefined1 (*) [16])(ray + 0x10);
      auVar53 = ZEXT1664(local_1768);
      local_1778 = *(undefined1 (*) [16])(ray + 0x20);
      auVar54 = ZEXT1664(local_1778);
      auVar26 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      local_16f8.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar26,auVar3);
      local_1808._4_4_ = auVar3._4_4_ ^ auVar20._4_4_;
      local_1808._0_4_ = auVar3._0_4_ ^ auVar20._0_4_;
      local_1808._8_4_ = auVar3._8_4_ ^ auVar20._8_4_;
      local_1808._12_4_ = auVar3._12_4_ ^ auVar20._12_4_;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar14;
      stack_near[1].field_0 = local_16f8;
      if (sVar14 != 0xfffffffffffffff8) {
        auVar25._8_4_ = 0x7fffffff;
        auVar25._0_8_ = 0x7fffffff7fffffff;
        auVar25._12_4_ = 0x7fffffff;
        auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar25);
        auVar42._8_4_ = 0x219392ef;
        auVar42._0_8_ = 0x219392ef219392ef;
        auVar42._12_4_ = 0x219392ef;
        auVar20 = vcmpps_avx(auVar20,auVar42,1);
        auVar26 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar42,auVar20);
        auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar25);
        auVar20 = vcmpps_avx(auVar20,auVar42,1);
        auVar33 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar42,auVar20);
        auVar20 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar25);
        auVar20 = vcmpps_avx(auVar20,auVar42,1);
        auVar20 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar42,auVar20);
        auVar25 = vrcpps_avx(auVar26);
        fVar5 = auVar25._0_4_;
        auVar34._0_4_ = auVar26._0_4_ * fVar5;
        fVar24 = auVar25._4_4_;
        auVar34._4_4_ = auVar26._4_4_ * fVar24;
        fVar30 = auVar25._8_4_;
        auVar34._8_4_ = auVar26._8_4_ * fVar30;
        fVar7 = auVar25._12_4_;
        auVar34._12_4_ = auVar26._12_4_ * fVar7;
        auVar38._8_4_ = 0x3f800000;
        auVar38._0_8_ = 0x3f8000003f800000;
        auVar38._12_4_ = 0x3f800000;
        auVar25 = vsubps_avx(auVar38,auVar34);
        auVar26 = vrcpps_avx(auVar33);
        fVar6 = auVar26._0_4_;
        auVar32._0_4_ = auVar33._0_4_ * fVar6;
        fVar29 = auVar26._4_4_;
        auVar32._4_4_ = auVar33._4_4_ * fVar29;
        fVar31 = auVar26._8_4_;
        auVar32._8_4_ = auVar33._8_4_ * fVar31;
        fVar8 = auVar26._12_4_;
        auVar32._12_4_ = auVar33._12_4_ * fVar8;
        auVar33 = vsubps_avx(auVar38,auVar32);
        auVar26 = vrcpps_avx(auVar20);
        local_1728 = auVar26._0_4_;
        auVar21._0_4_ = auVar20._0_4_ * local_1728;
        fStack_1724 = auVar26._4_4_;
        auVar21._4_4_ = auVar20._4_4_ * fStack_1724;
        fStack_1720 = auVar26._8_4_;
        auVar21._8_4_ = auVar20._8_4_ * fStack_1720;
        fStack_171c = auVar26._12_4_;
        auVar21._12_4_ = auVar20._12_4_ * fStack_171c;
        auVar20 = vsubps_avx(auVar38,auVar21);
        local_1708._0_4_ = fVar6 + fVar6 * auVar33._0_4_;
        local_1708._4_4_ = fVar29 + fVar29 * auVar33._4_4_;
        fStack_1700 = fVar31 + fVar31 * auVar33._8_4_;
        fStack_16fc = fVar8 + fVar8 * auVar33._12_4_;
        local_1718._0_4_ = fVar5 + fVar5 * auVar25._0_4_;
        local_1718._4_4_ = fVar24 + fVar24 * auVar25._4_4_;
        local_1718._8_4_ = fVar30 + fVar30 * auVar25._8_4_;
        local_1718._12_4_ = fVar7 + fVar7 * auVar25._12_4_;
        auVar28 = ZEXT1664(local_1718);
        local_1728 = local_1728 + local_1728 * auVar20._0_4_;
        fStack_1724 = fStack_1724 + fStack_1724 * auVar20._4_4_;
        fStack_1720 = fStack_1720 + fStack_1720 * auVar20._8_4_;
        fStack_171c = fStack_171c + fStack_171c * auVar20._12_4_;
        pNVar13 = stack_node + 1;
        auVar20 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT416(0) << 0x20);
        auVar26._8_4_ = 0xff800000;
        auVar26._0_8_ = 0xff800000ff800000;
        auVar26._12_4_ = 0xff800000;
        auVar20 = vblendvps_avx(auVar26,auVar20,auVar3);
        auVar48 = ZEXT1664(auVar20);
        local_1748 = mm_lookupmask_ps._0_8_;
        uStack_1740 = mm_lookupmask_ps._8_8_;
        paVar15 = &stack_near[2].field_0;
        do {
          auVar20 = auVar48._0_16_;
LAB_00306bfe:
          aVar27 = paVar15[-1];
          paVar15 = paVar15 + -1;
          auVar26 = vcmpps_avx((undefined1  [16])aVar27,auVar48._0_16_,1);
          if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar26[0xf] < '\0') {
LAB_00306c19:
            auVar26 = auVar48._0_16_;
            uVar16 = (uint)sVar14;
            if ((sVar14 & 8) == 0) goto code_r0x00306c23;
            if (sVar14 == 0xfffffffffffffff8) break;
            auVar33 = vcmpps_avx(auVar26,(undefined1  [16])aVar27,6);
            if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar33[0xf] < '\0') {
              uVar9 = (ulong)(uVar16 & 0xf);
              auVar33 = vpcmpeqd_avx(auVar28._0_16_,auVar28._0_16_);
              auVar19 = local_1808;
              if (uVar9 != 8) {
                auVar25 = local_1808 ^ auVar33;
                uVar12 = 1;
                do {
                  local_17c0.geomID = *(uint *)(((sVar14 & 0xfffffffffffffff0) - 8) + uVar12 * 8);
                  local_1790 = (context->scene->geometries).items[local_17c0.geomID].ptr;
                  uVar16 = local_1790->mask;
                  auVar18._4_4_ = uVar16;
                  auVar18._0_4_ = uVar16;
                  auVar18._8_4_ = uVar16;
                  auVar18._12_4_ = uVar16;
                  auVar26 = vandps_avx(auVar18,*(undefined1 (*) [16])(ray + 0x90));
                  auVar26 = vpcmpeqd_avx(auVar26,_DAT_01f7aa10);
                  auVar33 = auVar25 & ~auVar26;
                  auVar4._8_8_ = uStack_1740;
                  auVar4._0_8_ = local_1748;
                  local_1738 = auVar25;
                  if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar33[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar26,auVar25);
                    local_17c0.primID = *(uint *)(((sVar14 & 0xfffffffffffffff0) - 4) + uVar12 * 8);
                    local_17c0.valid = (int *)&mask;
                    local_17c0.geometryUserPtr = local_1790->userPtr;
                    local_17c0.context = context->user;
                    local_17c0.N = 4;
                    local_1788 = 0;
                    local_1780 = context->args;
                    p_Var10 = local_1780->intersect;
                    if (p_Var10 == (RTCIntersectFunctionN)0x0) {
                      p_Var10 = (RTCIntersectFunctionN)
                                local_1790[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i;
                    }
                    local_17c0.rayhit = (RTCRayHitN *)ray;
                    (*p_Var10)(&local_17c0);
                    auVar4 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa10,1);
                    auVar52 = ZEXT1664(local_1758);
                    auVar53 = ZEXT1664(local_1768);
                    auVar54 = ZEXT1664(local_1778);
                    auVar48 = ZEXT1664(auVar20);
                  }
                  auVar26 = auVar48._0_16_;
                  auVar25 = vandnps_avx(auVar4,local_1738);
                  auVar33 = local_1738 & ~auVar4;
                } while (((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar33[0xf] < '\0') &&
                        (bVar17 = uVar12 < uVar9 - 8, uVar12 = uVar12 + 1, local_1738 = auVar25,
                        bVar17));
                auVar33 = vpcmpeqd_avx(local_1738,local_1738);
                auVar19._0_4_ = auVar25._0_4_ ^ auVar33._0_4_;
                auVar19._4_4_ = auVar25._4_4_ ^ auVar33._4_4_;
                auVar19._8_4_ = auVar25._8_4_ ^ auVar33._8_4_;
                auVar19._12_4_ = auVar25._12_4_ ^ auVar33._12_4_;
              }
              auVar28 = ZEXT1664(auVar33);
              local_1808 = vpor_avx(local_1808,auVar19);
              auVar33 = auVar33 & ~local_1808;
              if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar33[0xf] < '\0') {
                auVar20._8_4_ = 0xff800000;
                auVar20._0_8_ = 0xff800000ff800000;
                auVar20._12_4_ = 0xff800000;
                auVar20 = vblendvps_avx(auVar26,auVar20,local_1808);
                auVar48 = ZEXT1664(auVar20);
                goto LAB_00306fe8;
              }
              break;
            }
          }
LAB_00306fe8:
          sVar14 = pNVar13[-1].ptr;
          pNVar13 = pNVar13 + -1;
          if (sVar14 == 0xfffffffffffffff8) break;
        } while( true );
      }
LAB_00307006:
      auVar3 = vandps_avx(auVar3,local_1808);
      auVar23._8_4_ = 0xff800000;
      auVar23._0_8_ = 0xff800000ff800000;
      auVar23._12_4_ = 0xff800000;
      auVar3 = vmaskmovps_avx(auVar3,auVar23);
      *(undefined1 (*) [16])(ray + 0x80) = auVar3;
    }
  }
  return;
code_r0x00306c23:
  uVar9 = sVar14 & 0xfffffffffffffff0;
  aVar22.i[2] = 0x7f800000;
  aVar22._0_8_ = 0x7f8000007f800000;
  aVar22.i[3] = 0x7f800000;
  lVar11 = -0x10;
  sVar14 = 8;
  do {
    sVar2 = *(size_t *)(uVar9 + 0x20 + lVar11 * 2);
    if (sVar2 == 8) {
      auVar28 = ZEXT1664((undefined1  [16])aVar22);
      break;
    }
    fVar5 = *(float *)(uVar9 + 0x90 + lVar11);
    fVar6 = *(float *)(uVar9 + 0x30 + lVar11);
    auVar26 = *(undefined1 (*) [16])(ray + 0x70);
    fVar24 = auVar26._0_4_;
    fVar29 = auVar26._4_4_;
    fVar30 = auVar26._8_4_;
    fVar31 = auVar26._12_4_;
    auVar33._0_4_ = fVar24 * fVar5 + fVar6;
    auVar33._4_4_ = fVar29 * fVar5 + fVar6;
    auVar33._8_4_ = fVar30 * fVar5 + fVar6;
    auVar33._12_4_ = fVar31 * fVar5 + fVar6;
    fVar5 = *(float *)(uVar9 + 0xb0 + lVar11);
    fVar6 = *(float *)(uVar9 + 0x50 + lVar11);
    auVar35._0_4_ = fVar24 * fVar5 + fVar6;
    auVar35._4_4_ = fVar29 * fVar5 + fVar6;
    auVar35._8_4_ = fVar30 * fVar5 + fVar6;
    auVar35._12_4_ = fVar31 * fVar5 + fVar6;
    fVar5 = *(float *)(uVar9 + 0xd0 + lVar11);
    fVar6 = *(float *)(uVar9 + 0x70 + lVar11);
    auVar39._0_4_ = fVar24 * fVar5 + fVar6;
    auVar39._4_4_ = fVar29 * fVar5 + fVar6;
    auVar39._8_4_ = fVar30 * fVar5 + fVar6;
    auVar39._12_4_ = fVar31 * fVar5 + fVar6;
    fVar5 = *(float *)(uVar9 + 0xa0 + lVar11);
    fVar6 = *(float *)(uVar9 + 0x40 + lVar11);
    auVar43._0_4_ = fVar24 * fVar5 + fVar6;
    auVar43._4_4_ = fVar29 * fVar5 + fVar6;
    auVar43._8_4_ = fVar30 * fVar5 + fVar6;
    auVar43._12_4_ = fVar31 * fVar5 + fVar6;
    fVar5 = *(float *)(uVar9 + 0xc0 + lVar11);
    fVar6 = *(float *)(uVar9 + 0x60 + lVar11);
    auVar46._0_4_ = fVar6 + fVar24 * fVar5;
    auVar46._4_4_ = fVar6 + fVar29 * fVar5;
    auVar46._8_4_ = fVar6 + fVar30 * fVar5;
    auVar46._12_4_ = fVar6 + fVar31 * fVar5;
    fVar5 = *(float *)(uVar9 + 0xe0 + lVar11);
    fVar6 = *(float *)(uVar9 + 0x80 + lVar11);
    auVar49._0_4_ = fVar5 * fVar24 + fVar6;
    auVar49._4_4_ = fVar5 * fVar29 + fVar6;
    auVar49._8_4_ = fVar5 * fVar30 + fVar6;
    auVar49._12_4_ = fVar5 * fVar31 + fVar6;
    auVar33 = vsubps_avx(auVar33,auVar52._0_16_);
    auVar51._0_4_ = local_1718._0_4_ * auVar33._0_4_;
    auVar51._4_4_ = local_1718._4_4_ * auVar33._4_4_;
    auVar51._8_4_ = local_1718._8_4_ * auVar33._8_4_;
    auVar51._12_4_ = local_1718._12_4_ * auVar33._12_4_;
    auVar33 = vsubps_avx(auVar35,auVar53._0_16_);
    auVar36._0_4_ = (float)local_1708._0_4_ * auVar33._0_4_;
    auVar36._4_4_ = (float)local_1708._4_4_ * auVar33._4_4_;
    auVar36._8_4_ = fStack_1700 * auVar33._8_4_;
    auVar36._12_4_ = fStack_16fc * auVar33._12_4_;
    auVar33 = vsubps_avx(auVar39,auVar54._0_16_);
    auVar40._0_4_ = local_1728 * auVar33._0_4_;
    auVar40._4_4_ = fStack_1724 * auVar33._4_4_;
    auVar40._8_4_ = fStack_1720 * auVar33._8_4_;
    auVar40._12_4_ = fStack_171c * auVar33._12_4_;
    auVar33 = vsubps_avx(auVar43,auVar52._0_16_);
    auVar44._0_4_ = local_1718._0_4_ * auVar33._0_4_;
    auVar44._4_4_ = local_1718._4_4_ * auVar33._4_4_;
    auVar44._8_4_ = local_1718._8_4_ * auVar33._8_4_;
    auVar44._12_4_ = local_1718._12_4_ * auVar33._12_4_;
    auVar33 = vsubps_avx(auVar46,auVar53._0_16_);
    auVar47._0_4_ = (float)local_1708._0_4_ * auVar33._0_4_;
    auVar47._4_4_ = (float)local_1708._4_4_ * auVar33._4_4_;
    auVar47._8_4_ = fStack_1700 * auVar33._8_4_;
    auVar47._12_4_ = fStack_16fc * auVar33._12_4_;
    auVar33 = vsubps_avx(auVar49,auVar54._0_16_);
    auVar50._0_4_ = local_1728 * auVar33._0_4_;
    auVar50._4_4_ = fStack_1724 * auVar33._4_4_;
    auVar50._8_4_ = fStack_1720 * auVar33._8_4_;
    auVar50._12_4_ = fStack_171c * auVar33._12_4_;
    auVar33 = vpminsd_avx(auVar51,auVar44);
    auVar25 = vpminsd_avx(auVar36,auVar47);
    auVar33 = vpmaxsd_avx(auVar33,auVar25);
    auVar25 = vpminsd_avx(auVar40,auVar50);
    auVar33 = vpmaxsd_avx(auVar33,auVar25);
    auVar25 = vpmaxsd_avx(auVar51,auVar44);
    auVar21 = vpmaxsd_avx(auVar36,auVar47);
    auVar48 = ZEXT1664(auVar20);
    auVar21 = vpminsd_avx(auVar25,auVar21);
    auVar25 = vpmaxsd_avx(auVar40,auVar50);
    auVar25 = vpminsd_avx(auVar25,auVar20);
    auVar21 = vpminsd_avx(auVar21,auVar25);
    auVar25 = vpmaxsd_avx(auVar33,(undefined1  [16])local_16f8);
    if ((uVar16 & 7) == 6) {
      auVar25 = vcmpps_avx(auVar25,auVar21,2);
      uVar1 = *(undefined4 *)(uVar9 + 0xf0 + lVar11);
      auVar41._4_4_ = uVar1;
      auVar41._0_4_ = uVar1;
      auVar41._8_4_ = uVar1;
      auVar41._12_4_ = uVar1;
      auVar21 = vcmpps_avx(auVar41,auVar26,2);
      uVar1 = *(undefined4 *)(uVar9 + 0x100 + lVar11);
      auVar45._4_4_ = uVar1;
      auVar45._0_4_ = uVar1;
      auVar45._8_4_ = uVar1;
      auVar45._12_4_ = uVar1;
      auVar26 = vcmpps_avx(auVar26,auVar45,1);
      auVar26 = vandps_avx(auVar21,auVar26);
      auVar26 = vandps_avx(auVar26,auVar25);
    }
    else {
      auVar26 = vcmpps_avx(auVar25,auVar21,2);
    }
    auVar25 = vcmpps_avx(auVar20,(undefined1  [16])aVar27,6);
    auVar26 = vandps_avx(auVar26,auVar25);
    auVar26 = vpslld_avx(auVar26,0x1f);
    if ((((auVar26 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar26 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar26 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar26[0xf]) {
      auVar28 = ZEXT1664((undefined1  [16])aVar22);
      sVar2 = sVar14;
    }
    else {
      auVar37._8_4_ = 0x7f800000;
      auVar37._0_8_ = 0x7f8000007f800000;
      auVar37._12_4_ = 0x7f800000;
      auVar26 = vblendvps_avx(auVar37,auVar33,auVar26);
      auVar28 = ZEXT1664(auVar26);
      if (sVar14 != 8) {
        pNVar13->ptr = sVar14;
        pNVar13 = pNVar13 + 1;
        *paVar15 = aVar22;
        paVar15 = paVar15 + 1;
      }
    }
    sVar14 = sVar2;
    aVar22 = auVar28._0_16_;
    lVar11 = lVar11 + 4;
  } while (lVar11 != 0);
  aVar27 = auVar28._0_16_;
  if (sVar14 == 8) goto code_r0x00306e2b;
  goto LAB_00306c19;
code_r0x00306e2b:
  sVar14 = pNVar13[-1].ptr;
  pNVar13 = pNVar13 + -1;
  if (sVar14 == 0xfffffffffffffff8) goto LAB_00307006;
  goto LAB_00306bfe;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }